

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void __thiscall Z80::OpCode_MULUB(Z80 *this)

{
  bool bVar1;
  Z80Reg ZVar2;
  char **p;
  int local_c [3];
  
  local_c[2] = 0xffffffff;
  local_c[0] = -1;
  local_c[1] = -1;
  ZVar2 = GetRegister((char **)this);
  if (ZVar2 == Z80_A) {
    p = &lp;
    bVar1 = comma(&lp);
    ZVar2 = Z80_A;
    if (bVar1) {
      ZVar2 = GetRegister(p);
    }
  }
  switch(ZVar2) {
  case Z80_B:
    local_c[1] = 0xc1;
    break;
  case Z80_C:
    local_c[1] = 0xc9;
    break;
  case Z80_D:
    local_c[1] = 0xd1;
    break;
  case Z80_E:
    local_c[1] = 0xd9;
    break;
  default:
    goto switchD_0013986d_default;
  }
  local_c[0] = 0xed;
switchD_0013986d_default:
  EmitBytes(local_c,true);
  return;
}

Assistant:

static void OpCode_MULUB() {
		Z80Reg reg;
		int e[3];
		e[0] = e[1] = e[2] = -1;
		if ((reg = GetRegister(lp)) == Z80_A && comma(lp)) {
			reg = GetRegister(lp);
		}
		switch (reg) {
		case Z80_B:
			e[0] = 0xed; e[1] = 0xc1; break;
		case Z80_C:
			e[0] = 0xed; e[1] = 0xc9; break;
		case Z80_D:
			e[0] = 0xed; e[1] = 0xd1; break;
		case Z80_E:
			e[0] = 0xed; e[1] = 0xd9; break;
		default:
			;
		}
		EmitBytes(e, true);
	}